

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ClientImpl::copy_settings(ClientImpl *this,ClientImpl *rhs)

{
  ClientImpl *rhs_local;
  ClientImpl *this_local;
  
  std::__cxx11::string::operator=
            ((string *)&this->client_cert_path_,(string *)&rhs->client_cert_path_);
  std::__cxx11::string::operator=
            ((string *)&this->client_key_path_,(string *)&rhs->client_key_path_);
  this->connection_timeout_sec_ = rhs->connection_timeout_sec_;
  this->read_timeout_sec_ = rhs->read_timeout_sec_;
  this->read_timeout_usec_ = rhs->read_timeout_usec_;
  this->write_timeout_sec_ = rhs->write_timeout_sec_;
  this->write_timeout_usec_ = rhs->write_timeout_usec_;
  std::__cxx11::string::operator=
            ((string *)&this->basic_auth_username_,(string *)&rhs->basic_auth_username_);
  std::__cxx11::string::operator=
            ((string *)&this->basic_auth_password_,(string *)&rhs->basic_auth_password_);
  std::__cxx11::string::operator=
            ((string *)&this->bearer_token_auth_token_,(string *)&rhs->bearer_token_auth_token_);
  this->keep_alive_ = (bool)(rhs->keep_alive_ & 1);
  this->follow_location_ = (bool)(rhs->follow_location_ & 1);
  this->url_encode_ = (bool)(rhs->url_encode_ & 1);
  this->address_family_ = rhs->address_family_;
  this->tcp_nodelay_ = (bool)(rhs->tcp_nodelay_ & 1);
  std::function<void_(int)>::operator=(&this->socket_options_,&rhs->socket_options_);
  this->compress_ = (bool)(rhs->compress_ & 1);
  this->decompress_ = (bool)(rhs->decompress_ & 1);
  std::__cxx11::string::operator=((string *)&this->interface_,(string *)&rhs->interface_);
  std::__cxx11::string::operator=((string *)&this->proxy_host_,(string *)&rhs->proxy_host_);
  this->proxy_port_ = rhs->proxy_port_;
  std::__cxx11::string::operator=
            ((string *)&this->proxy_basic_auth_username_,(string *)&rhs->proxy_basic_auth_username_)
  ;
  std::__cxx11::string::operator=
            ((string *)&this->proxy_basic_auth_password_,(string *)&rhs->proxy_basic_auth_password_)
  ;
  std::__cxx11::string::operator=
            ((string *)&this->proxy_bearer_token_auth_token_,
             (string *)&rhs->proxy_bearer_token_auth_token_);
  std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator=
            (&this->logger_,&rhs->logger_);
  return;
}

Assistant:

inline void ClientImpl::copy_settings(const ClientImpl &rhs) {
  client_cert_path_ = rhs.client_cert_path_;
  client_key_path_ = rhs.client_key_path_;
  connection_timeout_sec_ = rhs.connection_timeout_sec_;
  read_timeout_sec_ = rhs.read_timeout_sec_;
  read_timeout_usec_ = rhs.read_timeout_usec_;
  write_timeout_sec_ = rhs.write_timeout_sec_;
  write_timeout_usec_ = rhs.write_timeout_usec_;
  basic_auth_username_ = rhs.basic_auth_username_;
  basic_auth_password_ = rhs.basic_auth_password_;
  bearer_token_auth_token_ = rhs.bearer_token_auth_token_;
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  digest_auth_username_ = rhs.digest_auth_username_;
  digest_auth_password_ = rhs.digest_auth_password_;
#endif
  keep_alive_ = rhs.keep_alive_;
  follow_location_ = rhs.follow_location_;
  url_encode_ = rhs.url_encode_;
  address_family_ = rhs.address_family_;
  tcp_nodelay_ = rhs.tcp_nodelay_;
  socket_options_ = rhs.socket_options_;
  compress_ = rhs.compress_;
  decompress_ = rhs.decompress_;
  interface_ = rhs.interface_;
  proxy_host_ = rhs.proxy_host_;
  proxy_port_ = rhs.proxy_port_;
  proxy_basic_auth_username_ = rhs.proxy_basic_auth_username_;
  proxy_basic_auth_password_ = rhs.proxy_basic_auth_password_;
  proxy_bearer_token_auth_token_ = rhs.proxy_bearer_token_auth_token_;
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  proxy_digest_auth_username_ = rhs.proxy_digest_auth_username_;
  proxy_digest_auth_password_ = rhs.proxy_digest_auth_password_;
#endif
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  ca_cert_file_path_ = rhs.ca_cert_file_path_;
  ca_cert_dir_path_ = rhs.ca_cert_dir_path_;
  ca_cert_store_ = rhs.ca_cert_store_;
#endif
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  server_certificate_verification_ = rhs.server_certificate_verification_;
#endif
  logger_ = rhs.logger_;
}